

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterovector.hpp
# Opt level: O2

int __thiscall heterovector::count(heterovector *this,variant<int,_float,_double> val)

{
  _Variadic_union<int,_float,_double> *p_Var1;
  bool bVar2;
  int iVar3;
  _Variadic_union<int,_float,_double> *p_Var4;
  _Variadic_union<int,_float,_double> local_48;
  _Variadic_union<int,_float,_double> _Stack_40;
  variant<int,_float,_double> local_38;
  
  p_Var1 = (_Variadic_union<int,_float,_double> *)
           (this->vec).
           super__Vector_base<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar3 = 0;
  for (p_Var4 = (_Variadic_union<int,_float,_double> *)
                (this->vec).
                super__Vector_base<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start; p_Var4 != p_Var1; p_Var4 = p_Var4 + 2) {
    local_48 = *p_Var4;
    _Stack_40 = p_Var4[1];
    bVar2 = std::operator==((variant<int,_float,_double> *)&local_48._M_first,&local_38);
    iVar3 = iVar3 + (uint)bVar2;
  }
  return iVar3;
}

Assistant:

int heterovector::count(std::variant<int, float, double> val) {
    int counter = 0;
    for (auto i : vec)
        if (i == val)
            counter++;

    return counter;
}